

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall
CS248::DynamicScene::XFormWidget::draw_pick(XFormWidget *this,int *pickID,bool transformed)

{
  map<int,_CS248::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Selection::Axis>_>_>
  *this_00;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_01;
  Mode MVar1;
  undefined1 *puVar2;
  int iVar3;
  mapped_type *pmVar4;
  allocator_type local_81;
  vector<unsigned_char,_std::allocator<unsigned_char>_> Xcolor;
  vector<unsigned_char,_std::allocator<unsigned_char>_> Ccolor;
  vector<unsigned_char,_std::allocator<unsigned_char>_> Zcolor;
  vector<unsigned_char,_std::allocator<unsigned_char>_> Ycolor;
  
  if ((this->target).object != (SceneObject *)0x0) {
    this_00 = &this->pickIDToAxis;
    Xcolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = *pickID;
    pmVar4 = std::
             map<int,_CS248::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Selection::Axis>_>_>
             ::operator[](this_00,(key_type_conflict *)&Xcolor);
    *pmVar4 = X;
    Xcolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = *pickID + 1;
    pmVar4 = std::
             map<int,_CS248::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Selection::Axis>_>_>
             ::operator[](this_00,(key_type_conflict *)&Xcolor);
    *pmVar4 = Y;
    Xcolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = *pickID + 2;
    pmVar4 = std::
             map<int,_CS248::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Selection::Axis>_>_>
             ::operator[](this_00,(key_type_conflict *)&Xcolor);
    *pmVar4 = Z;
    Xcolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = *pickID + 3;
    pmVar4 = std::
             map<int,_CS248::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Selection::Axis>_>_>
             ::operator[](this_00,(key_type_conflict *)&Xcolor);
    *pmVar4 = Center;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&Xcolor,4,(allocator_type *)&Ycolor);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&Ycolor,4,(allocator_type *)&Zcolor);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&Zcolor,4,(allocator_type *)&Ccolor);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&Ccolor,4,&local_81);
    iVar3 = *pickID;
    puVar2 = (undefined1 *)
             CONCAT44(Xcolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                      (int)Xcolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start);
    *puVar2 = (char)iVar3;
    puVar2[1] = (char)((uint)iVar3 >> 8);
    puVar2[2] = (char)((uint)iVar3 >> 0x10);
    iVar3 = *pickID + 1;
    *Ycolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = (uchar)iVar3;
    Ycolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = (uchar)((uint)iVar3 >> 8);
    Ycolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = (uchar)((uint)iVar3 >> 0x10);
    iVar3 = *pickID + 2;
    *Zcolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = (uchar)iVar3;
    Zcolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = (uchar)((uint)iVar3 >> 8);
    Zcolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = (uchar)((uint)iVar3 >> 0x10);
    iVar3 = *pickID + 3;
    *Ccolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = (uchar)iVar3;
    Ccolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = (uchar)((uint)iVar3 >> 8);
    Ccolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = (uchar)((uint)iVar3 >> 0x10);
    Ccolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '@';
    Zcolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '@';
    Ycolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '@';
    *(undefined1 *)
     (CONCAT44(Xcolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_,
               (int)Xcolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start) + 3) = 0x40;
    this_01 = &this->axisColors;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::resize(this_01,4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((this_01->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,&Xcolor);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((this_01->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,&Ycolor);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((this_01->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 2,&Zcolor);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((this_01->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 3,&Ccolor);
    glPushMatrix();
    MVar1 = this->mode;
    if (MVar1 == Translate) {
      drawTranslateHandles(this);
    }
    else if (MVar1 == Rotate) {
      drawRotateHandles(this);
    }
    else if (MVar1 == Scale) {
      drawScaleHandles(this);
    }
    glPopMatrix();
    *pickID = *pickID + 4;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&Ccolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&Zcolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&Ycolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&Xcolor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  return;
}

Assistant:

void XFormWidget::draw_pick(int& pickID, bool transformed) {
  if (target.object == nullptr) return;

  pickIDToAxis[pickID + 0] = Selection::Axis::X;
  pickIDToAxis[pickID + 1] = Selection::Axis::Y;
  pickIDToAxis[pickID + 2] = Selection::Axis::Z;
  pickIDToAxis[pickID + 3] = Selection::Axis::Center;

  vector<GLubyte> Xcolor(4), Ycolor(4), Zcolor(4), Ccolor(4);
  IndexToRGB(pickID + 0, Xcolor[0], Xcolor[1], Xcolor[2]);
  IndexToRGB(pickID + 1, Ycolor[0], Ycolor[1], Ycolor[2]);
  IndexToRGB(pickID + 2, Zcolor[0], Zcolor[1], Zcolor[2]);
  IndexToRGB(pickID + 3, Ccolor[0], Ccolor[1], Ccolor[2]);
  Xcolor[3] = Ycolor[3] = Zcolor[3] = Ccolor[3] = 64;

  axisColors.resize(4);
  axisColors[0] = Xcolor;
  axisColors[1] = Ycolor;
  axisColors[2] = Zcolor;
  axisColors[3] = Ccolor;

  glPushMatrix();

  switch (mode) {
    case Mode::Translate:
      drawTranslateHandles();
      break;
    case Mode::Rotate:
      drawRotateHandles();
      break;
    case Mode::Scale:
      drawScaleHandles();
      break;
    default:
      break;
  }
  glPopMatrix();

  pickID += 4;
}